

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void matrixmultiply(float32 **c,float32 **a,float32 **b,int32 n)

{
  char uplo;
  char side;
  float32 alpha;
  int32 n_local;
  
  side = 'L';
  uplo = 'L';
  alpha = 1.0;
  n_local = n;
  ssymm_(&side,&uplo,&n_local,&n_local,(real *)&alpha,(real *)*a,&n_local,(real *)*b,&n_local,
         (real *)&alpha,(real *)*c,&n_local);
  return;
}

Assistant:

void
matrixmultiply(float32 ** c, float32 ** a, float32 ** b, int32 n)
{
    char side, uplo;
    float32 alpha;

    side = 'L';
    uplo = 'L';
    alpha = 1.0;
    ssymm_(&side, &uplo, &n, &n, &alpha, a[0], &n, b[0], &n, &alpha, c[0], &n);
}